

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

RenderPassWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateRenderPass
          (RenderPassWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkRenderPassCreateInfo2 *RenderPassCI,char *DebugName)

{
  char (*Args_1) [48];
  string msg;
  string local_48;
  
  Args_1 = (char (*) [48])DebugName;
  if (RenderPassCI->sType != VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2) {
    Diligent::FormatString<char[26],char[66]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RenderPassCI.sType == VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2",
               (char (*) [66])DebugName);
    Args_1 = (char (*) [48])0xed;
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xed);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_EnabledExtFeatures).RenderPass2 == false) {
    Diligent::FormatString<char[26],char[48]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"GetEnabledExtFeatures().RenderPass2 != VK_FALSE",Args_1);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xee);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkRenderPass_T*,(VulkanUtilities::VulkanHandleTypeId)8,VkResult(*)(VkDevice_T*,VkRenderPassCreateInfo2_const*,VkAllocationCallbacks_const*,VkRenderPass_T**),VkRenderPassCreateInfo2>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkRenderPassCreateInfo2_ptr_VkAllocationCallbacks_ptr_VkRenderPass_T_ptr_ptr
              *)vkCreateRenderPass2KHR,RenderPassCI,DebugName,"render pass 2");
  return __return_storage_ptr__;
}

Assistant:

RenderPassWrapper VulkanLogicalDevice::CreateRenderPass(const VkRenderPassCreateInfo2& RenderPassCI, const char* DebugName) const
{
#if DILIGENT_USE_VOLK
    VERIFY_EXPR(RenderPassCI.sType == VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2);
    VERIFY_EXPR(GetEnabledExtFeatures().RenderPass2 != VK_FALSE);
    return CreateVulkanObject<VkRenderPass, VulkanHandleTypeId::RenderPass>(vkCreateRenderPass2KHR, RenderPassCI, DebugName, "render pass 2");
#else
    UNSUPPORTED("vkCreateRenderPass2KHR is only available through Volk");
    return RenderPassWrapper{};
#endif
}